

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O0

void __thiscall aeron::archive::Context::conclude(Context *this)

{
  bool bVar1;
  ulong uVar2;
  element_type *peVar3;
  socklen_t __len;
  shared_ptr<aeron::Aeron> local_2d0;
  Context local_2c0;
  undefined1 local_188 [344];
  string local_30 [32];
  Context *local_10;
  Context *this_local;
  
  local_10 = this;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    memset((Context *)(local_188 + 0x20),0,0x138);
    aeron::Context::Context((Context *)(local_188 + 0x20));
    aeron::Context::defaultAeronPath_abi_cxx11_();
    std::__cxx11::string::operator=((string *)&this->aeronDirectoryName_,local_30);
    std::__cxx11::string::~string(local_30);
    aeron::Context::~Context((Context *)(local_188 + 0x20));
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->aeron_);
  if (!bVar1) {
    memset(&local_2c0,0,0x138);
    aeron::Context::Context(&local_2c0);
    std::make_shared<aeron::Context,aeron::Context>((Context *)local_188);
    std::shared_ptr<aeron::Context>::operator=
              (&this->aeronContext_,(shared_ptr<aeron::Context> *)local_188);
    std::shared_ptr<aeron::Context>::~shared_ptr((shared_ptr<aeron::Context> *)local_188);
    aeron::Context::~Context(&local_2c0);
    peVar3 = std::__shared_ptr_access<aeron::Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<aeron::Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->aeronContext_);
    aeron::Context::aeronDir(peVar3,&this->aeronDirectoryName_);
    peVar3 = std::__shared_ptr_access<aeron::Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<aeron::Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->aeronContext_);
    Aeron::connect((int)&local_2d0,(sockaddr *)peVar3,__len);
    std::shared_ptr<aeron::Aeron>::operator=(&this->aeron_,&local_2d0);
    std::shared_ptr<aeron::Aeron>::~shared_ptr(&local_2d0);
  }
  return;
}

Assistant:

void Context::conclude() {
    if (aeronDirectoryName_.empty()) {
        aeronDirectoryName_ = aeron::Context().defaultAeronPath();
    }

    if (!aeron_) {
        aeronContext_ = std::make_shared<aeron::Context>(aeron::Context());
        aeronContext_->aeronDir(aeronDirectoryName_);
        aeron_ = aeron::Aeron::connect(*aeronContext_);
    }
}